

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wire_format_lite_inl.h
# Opt level: O1

bool google::protobuf::internal::WireFormatLite::
     ReadRepeatedPrimitive<unsigned_long,(google::protobuf::internal::WireFormatLite::FieldType)4>
               (int param_1,uint32 tag,CodedInputStream *input,RepeatedField<unsigned_long> *values)

{
  int iVar1;
  uint8 *puVar2;
  bool bVar3;
  byte *pbVar4;
  LogMessage *other;
  int iVar5;
  unsigned_long uVar6;
  pair<unsigned_long,_bool> pVar7;
  pair<unsigned_long,_bool> pVar8;
  LogFinisher local_75;
  uint local_74;
  uint local_70;
  uint local_6c;
  LogMessage local_68;
  
  puVar2 = input->buffer_;
  if ((puVar2 < input->buffer_end_) && (uVar6 = (unsigned_long)(char)*puVar2, -1 < (long)uVar6)) {
    input->buffer_ = puVar2 + 1;
    pVar7._8_8_ = 1;
    pVar7.first = (unsigned_long)(puVar2 + 1);
  }
  else {
    pVar7 = io::CodedInputStream::ReadVarint64Fallback(input);
    uVar6 = pVar7.first;
  }
  if (((undefined1  [16])pVar7 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
LAB_0024c11a:
    bVar3 = false;
  }
  else {
    if (values->current_size_ == values->total_size_) {
      RepeatedField<unsigned_long>::Reserve(values,values->total_size_ + 1);
    }
    iVar5 = values->current_size_;
    values->current_size_ = iVar5 + 1;
    values->rep_->elements[iVar5] = uVar6;
    bVar3 = true;
    if (iVar5 + 1 < values->total_size_) {
      local_70 = tag & 0xff | 0x80;
      local_74 = tag >> 7;
      iVar5 = values->total_size_ - iVar5;
      local_6c = tag;
      do {
        if (local_6c < 0x80) {
          pbVar4 = input->buffer_;
          if ((input->buffer_end_ <= pbVar4) || (*pbVar4 != local_6c)) break;
          pbVar4 = pbVar4 + 1;
        }
        else {
          if ((((0x3fff < local_6c) ||
               (pbVar4 = input->buffer_, *(int *)&input->buffer_end_ - (int)pbVar4 < 2)) ||
              (local_70 != *pbVar4)) || (local_74 != pbVar4[1])) break;
          pbVar4 = pbVar4 + 2;
        }
        input->buffer_ = pbVar4;
        if ((pbVar4 < input->buffer_end_) &&
           (uVar6 = (unsigned_long)(char)*pbVar4, -1 < (long)uVar6)) {
          input->buffer_ = pbVar4 + 1;
          pVar8._8_8_ = 1;
          pVar8.first = (unsigned_long)(pbVar4 + 1);
        }
        else {
          pVar8 = io::CodedInputStream::ReadVarint64Fallback(input);
          uVar6 = pVar8.first;
        }
        if (((undefined1  [16])pVar8 & (undefined1  [16])0x1) == (undefined1  [16])0x0)
        goto LAB_0024c11a;
        if (values->total_size_ <= values->current_size_) {
          LogMessage::LogMessage
                    (&local_68,LOGLEVEL_DFATAL,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/mlmodel/../deps/protobuf/src/google/protobuf/repeated_field.h"
                     ,0x456);
          other = LogMessage::operator<<
                            (&local_68,"CHECK failed: (current_size_) < (total_size_): ");
          LogFinisher::operator=(&local_75,other);
          LogMessage::~LogMessage(&local_68);
        }
        iVar1 = values->current_size_;
        values->current_size_ = iVar1 + 1;
        values->rep_->elements[iVar1] = uVar6;
        iVar5 = iVar5 + -1;
      } while (1 < iVar5);
      bVar3 = true;
    }
  }
  return bVar3;
}

Assistant:

inline bool WireFormatLite::ReadRepeatedPrimitive(
    int,  // tag_size, unused.
    uint32 tag,
    io::CodedInputStream* input,
    RepeatedField<CType>* values) {
  CType value;
  if (!ReadPrimitive<CType, DeclaredType>(input, &value)) return false;
  values->Add(value);
  int elements_already_reserved = values->Capacity() - values->size();
  while (elements_already_reserved > 0 && input->ExpectTag(tag)) {
    if (!ReadPrimitive<CType, DeclaredType>(input, &value)) return false;
    values->AddAlreadyReserved(value);
    elements_already_reserved--;
  }
  return true;
}